

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadLayerFromAsset
               (AssetResolutionResolver *resolver,string *resolved_asset_name,Layer *layer,
               string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  uint8_t *addr;
  size_t length;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  fmt local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream ss_e_1;
  undefined1 local_250 [8];
  Asset asset;
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  USDLoadOptions *options_local;
  string *err_local;
  string *warn_local;
  Layer *layer_local;
  string *resolved_asset_name_local;
  AssetResolutionResolver *resolver_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    AssetResolutionResolver::set_max_asset_bytes_in_mb
              (resolver,(ulong)options->max_allowed_asset_size_in_mb);
    Asset::Asset((Asset *)local_250);
    bVar1 = AssetResolutionResolver::open_asset
                      (resolver,(string *)resolved_asset_name,(string *)resolved_asset_name,
                       (Asset *)local_250,(string *)warn,(string *)err);
    if (bVar1) {
      addr = Asset::data((Asset *)local_250);
      length = Asset::size((Asset *)local_250);
      resolver_local._7_1_ =
           LoadLayerFromMemory(addr,length,resolved_asset_name,layer,warn,err,options);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3c8);
      poVar3 = ::std::operator<<((ostream *)local_3c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"LoadLayerFromAsset");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x55b);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_408,"Failed to open asset `{}`.",&local_409);
      fmt::format<std::__cxx11::string>(local_3e8,(string *)local_408,resolved_asset_name);
      poVar3 = ::std::operator<<((ostream *)local_3c8,(string *)local_3e8);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_3e8);
      ::std::__cxx11::string::~string(local_408);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_409);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_430);
        ::std::__cxx11::string::~string(local_430);
      }
      resolver_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_3c8);
    }
    Asset::~Asset((Asset *)local_250);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"LoadLayerFromAsset");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x554);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1b8,"Input asset name is empty.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,
                 (string *)
                 &asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    resolver_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return resolver_local._7_1_;
}

Assistant:

bool LoadLayerFromAsset(AssetResolutionResolver &resolver, const std::string &resolved_asset_name, Layer *layer,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {

  if (resolved_asset_name.empty()) {
    PUSH_ERROR_AND_RETURN("Input asset name is empty.");
  }

  resolver.set_max_asset_bytes_in_mb(options.max_allowed_asset_size_in_mb);

  Asset asset;
  if (!resolver.open_asset(resolved_asset_name, resolved_asset_name, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to open asset `{}`.", resolved_asset_name));
  }

  return LoadLayerFromMemory(asset.data(), asset.size(), resolved_asset_name, layer, warn, err,
                           options);
}